

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

PrecisionCase *
deqp::gls::BuiltinPrecisionTests::
createFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,2,4>,tcu::Vector<float,2>,tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
          (Context *context,string *name,
          Func<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_4>,_tcu::Vector<float,_2>,_tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *func)

{
  int iVar1;
  PrecisionCase *this;
  undefined **ppuVar2;
  
  iVar1 = (**(code **)(*(long *)func + 0x28))(func);
  if (iVar1 == 1) {
    this = (PrecisionCase *)operator_new(0x188);
    FuncCaseBase::FuncCaseBase((FuncCaseBase *)this,context,name,(FuncBase *)func);
    ppuVar2 = &PTR__PrecisionCase_00b63160;
  }
  else {
    if (iVar1 != -1) {
      return (PrecisionCase *)0x0;
    }
    this = (PrecisionCase *)operator_new(0x188);
    FuncCaseBase::FuncCaseBase((FuncCaseBase *)this,context,name,(FuncBase *)func);
    ppuVar2 = &PTR__PrecisionCase_00b63060;
  }
  (((PrecisionCase *)&this->super_TestCase)->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)ppuVar2;
  (((PrecisionCase *)&this[1].super_TestCase)->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)func;
  return this;
}

Assistant:

PrecisionCase* createFuncCase (const Context&	context,
							   const string&	name,
							   const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}